

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OISKeyboard.cpp
# Opt level: O0

bool __thiscall OIS::Keyboard::isModifierDown(Keyboard *this,Modifier mod)

{
  Modifier mod_local;
  Keyboard *this_local;
  
  return (this->mModifiers & mod) != 0;
}

Assistant:

bool Keyboard::isModifierDown(Modifier mod) const
{
#if defined(OIS_MSVC_COMPILER)
#pragma warning(push)
#pragma warning(disable : 4800)
#endif
	return (mModifiers & mod);
#if defined(OIS_MSVC_COMPILER)
#pragma warning(pop)
#endif
}